

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O2

vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *
dpfb::readKerningPairsGpos
          (vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
           *__return_storage_ptr__,Stream *stream,SfntOffsetTable *sfntOffsetTable,
          KerningParams *params)

{
  ushort uVar1;
  unsigned_short uVar2;
  uint16_t *puVar3;
  pointer puVar4;
  unsigned_short *puVar5;
  undefined8 uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t classCount;
  uint32_t uVar13;
  uint32_t uVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var18;
  StreamError *pSVar19;
  ulong uVar20;
  unsigned_short *puVar21;
  ulong uVar22;
  string *this;
  pointer puVar23;
  pointer puVar24;
  long lVar25;
  uint16_t *puVar26;
  bool bVar27;
  uint16_t local_162;
  string local_158;
  undefined1 local_130 [32];
  int local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uint local_e4;
  RawKerningPair local_e0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lookupIndices;
  LookupContext ctx;
  GlyphClasses local_98;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *local_78;
  ushort *local_70;
  long local_68;
  long local_60;
  undefined8 local_58;
  ulong local_50;
  unsigned_short local_48 [12];
  
  uVar13 = SfntOffsetTable::getTableOffset(sfntOffsetTable,0x47504f53);
  if (uVar13 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_78 = __return_storage_ptr__;
    (*stream->_vptr_Stream[7])(stream,(ulong)uVar13,0);
    uVar7 = streams::Stream::readU16Be(stream);
    if (uVar7 != 1) {
      pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_158,"Unsupported \"GPOS\" major version %u",(ulong)uVar7);
      streams::StreamError::runtime_error(pSVar19,&local_158);
      __cxa_throw(pSVar19,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[7])(stream,2,1);
    (*stream->_vptr_Stream[7])(stream,2,1);
    uVar7 = streams::Stream::readU16Be(stream);
    uVar8 = streams::Stream::readU16Be(stream);
    lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108 = (ulong)uVar13;
    (*stream->_vptr_Stream[7])(stream,(ulong)(uVar7 + uVar13),0);
    uVar9 = streams::Stream::readU16Be(stream);
    while (bVar27 = uVar9 != 0, uVar9 = uVar9 - 1, bVar27) {
      uVar14 = streams::Stream::readU32Be(stream);
      uVar10 = streams::Stream::readU16Be(stream);
      if (uVar14 == 0x6b65726e) {
        iVar15 = (*stream->_vptr_Stream[8])(stream);
        (*stream->_vptr_Stream[7])(stream,(ulong)((uint)uVar10 + uVar7 + uVar13),0);
        (*stream->_vptr_Stream[7])(stream,2,1);
        uVar10 = streams::Stream::readU16Be(stream);
        while (bVar27 = uVar10 != 0, uVar10 = uVar10 - 1, bVar27) {
          local_158._M_dataplus._M_p._0_2_ = streams::Stream::readU16Be(stream);
          _Var17 = std::
                   __find_if<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                             (lookupIndices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              lookupIndices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish,&local_158);
          if (_Var17._M_current ==
              lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      (&lookupIndices,(value_type_conflict4 *)&local_158);
          }
        }
        (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var,iVar15),0);
      }
    }
    ctx.kerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ctx.kerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ctx.kerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ctx.pxSize = params->pxSize;
    ctx.scale = (float)ctx.pxSize / (float)params->pxPerEm;
    local_108 = (ulong)((int)local_108 + (uint)uVar8);
    (*stream->_vptr_Stream[7])(stream,local_108,0);
    uVar7 = streams::Stream::readU16Be(stream);
    local_68 = local_108 + 2;
    local_70 = lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    for (puVar23 = lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                   ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ = local_78,
        puVar23 != local_70; puVar23 = puVar23 + 1) {
      uVar1 = *puVar23;
      if (uVar7 <= uVar1) {
        pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
        str::format_abi_cxx11_
                  (&local_158,"Lookup list lookupIdx (%u) >= lookupCount (%u)",(ulong)(uint)uVar1,
                   (ulong)uVar7);
        streams::StreamError::runtime_error(pSVar19,&local_158);
        __cxa_throw(pSVar19,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
      }
      (*stream->_vptr_Stream[7])(stream,local_68 + (ulong)(uint)uVar1 * 2,0);
      uVar8 = streams::Stream::readU16Be(stream);
      (*stream->_vptr_Stream[7])(stream,(ulong)((uint)uVar8 + (int)local_108),0);
      iVar15 = (*stream->_vptr_Stream[8])(stream);
      local_60 = CONCAT44(extraout_var_00,iVar15);
      uVar8 = streams::Stream::readU16Be(stream);
      if ((uVar8 == 9) || (uVar8 == 2)) {
        (*stream->_vptr_Stream[7])(stream,2,1);
        local_162 = streams::Stream::readU16Be(stream);
        while (bVar27 = local_162 != 0, local_162 = local_162 - 1, bVar27) {
          uVar9 = streams::Stream::readU16Be(stream);
          iVar15 = (*stream->_vptr_Stream[8])(stream);
          local_58 = CONCAT44(extraout_var_01,iVar15);
          lVar25 = (ulong)uVar9 + local_60;
          uVar9 = uVar8;
          while ((*stream->_vptr_Stream[7])(stream,lVar25,0), uVar9 == 9) {
            iVar15 = (*stream->_vptr_Stream[8])(stream);
            uVar9 = streams::Stream::readU16Be(stream);
            if (uVar9 != 1) {
              pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
              str::format_abi_cxx11_
                        (&local_158,"Unknown format of \"GPOS\" extension subtable: %u",(ulong)uVar9
                        );
              streams::StreamError::runtime_error(pSVar19,&local_158);
              __cxa_throw(pSVar19,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error
                         );
            }
            uVar9 = streams::Stream::readU16Be(stream);
            if (uVar9 == 9) {
              pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
              streams::StreamError::runtime_error
                        (pSVar19,"\"GPOS\" extension subtables cannot be nested");
              goto LAB_0011a34e;
            }
            uVar13 = streams::Stream::readU32Be(stream);
            lVar25 = CONCAT44(extraout_var_02,iVar15) + (ulong)uVar13;
          }
          if (uVar9 == 2) {
            uVar9 = streams::Stream::readU16Be(stream);
            if (uVar9 == 2) {
              iVar15 = (*stream->_vptr_Stream[8])(stream);
              uVar9 = streams::Stream::readU16Be(stream);
              uVar10 = streams::Stream::readU16Be(stream);
              uVar11 = streams::Stream::readU16Be(stream);
              local_100 = CONCAT44(local_100._4_4_,(uint)uVar10);
              local_e4 = (uint)uVar11;
              if ((char)((local_e4 & 4) >> 2) == '\0' && (uVar10 & 4) != 0) {
                uVar10 = streams::Stream::readU16Be(stream);
                uVar11 = streams::Stream::readU16Be(stream);
                uVar12 = streams::Stream::readU16Be(stream);
                if (uVar12 == 0) {
                  pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
                  streams::StreamError::runtime_error
                            (pSVar19,"\"GPOS\" pair adjustment format 2 class 1 count is 0");
LAB_0011a34e:
                  __cxa_throw(pSVar19,&streams::StreamError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                classCount = streams::Stream::readU16Be(stream);
                if (classCount == 0) {
                  pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
                  streams::StreamError::runtime_error
                            (pSVar19,"\"GPOS\" pair adjustment format 2 class 2 count is 0");
                  goto LAB_0011a34e;
                }
                iVar16 = (*stream->_vptr_Stream[8])(stream);
                lVar25 = CONCAT44(extraout_var_06,iVar15) + -2;
                (*stream->_vptr_Stream[7])(stream,(ulong)uVar9 + lVar25,0);
                readCovarageTable((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  &local_158,stream);
                (*stream->_vptr_Stream[7])(stream,(ulong)uVar10 + lVar25,0);
                local_50 = (ulong)uVar12;
                readClassDefTable((GlyphClasses *)local_130,stream,uVar12);
                (*stream->_vptr_Stream[7])(stream,(ulong)uVar11 + lVar25,0);
                local_f0 = (ulong)classCount;
                readClassDefTable(&local_98,stream,classCount);
                puVar5 = (unsigned_short *)
                         CONCAT44(local_158._M_string_length._4_4_,(int)local_158._M_string_length);
                for (puVar21 = (unsigned_short *)
                               CONCAT62(local_158._M_dataplus._M_p._2_6_,
                                        (uint16_t)local_158._M_dataplus._M_p); puVar21 != puVar5;
                    puVar21 = puVar21 + 1) {
                  local_130._24_2_ = *puVar21;
                  local_48[0] = local_130._24_2_;
                  if (1 < (ulong)((long)(local_130._8_8_ - local_130._0_8_) / 0x18)) {
                    for (uVar20 = 1; uVar6 = local_130._0_8_, uVar20 = uVar20 & 0xffff,
                        uVar20 < (ulong)((long)(local_130._8_8_ - local_130._0_8_) / 0x18);
                        uVar20 = (ulong)((int)uVar20 + 1)) {
                      if (**(ushort **)(local_130._0_8_ + uVar20 * 0x18) <= (ushort)local_130._24_2_
                         ) {
                        if ((((ushort)local_130._24_2_ <=
                              *(ushort *)
                               (*(long *)((pointer)(local_130._0_8_ + uVar20 * 0x18) + 8) + -2)) &&
                            (_Var18 = std::
                                      __lower_bound<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_short,__gnu_cxx::__ops::_Iter_less_val>
                                                (*(ushort **)(local_130._0_8_ + uVar20 * 0x18),
                                                 *(long *)((pointer)(local_130._0_8_ + uVar20 * 0x18
                                                                    ) + 8),local_130 + 0x18),
                            _Var18._M_current !=
                            *(unsigned_short **)((pointer)(uVar6 + uVar20 * 0x18) + 8))) &&
                           (*_Var18._M_current == local_130._24_2_)) {
                          if (uVar20 != 0) goto LAB_0011a087;
                          break;
                        }
                      }
                    }
                  }
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             local_130._0_8_,local_48);
LAB_0011a087:
                }
                (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var_07,iVar16),0);
                uVar20 = 0;
                while (uVar20 != local_50) {
                  local_f8 = uVar20;
                  for (uVar22 = 0; uVar22 != local_f0; uVar22 = uVar22 + 1) {
                    readValuesForSize(stream,(uint32_t)lVar25,&ctx,(int *)(local_130 + 0x18),
                                      (int)local_100);
                    readValuesForSize(stream,(uint32_t)lVar25,&ctx,(int *)local_48,local_e4);
                    uVar20 = local_f8;
                    iVar15 = local_110;
                    if (local_110 != 0) {
                      std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::
                      reserve(&ctx.kerningPairs,
                              ((long)local_98.
                                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_98.
                                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 1) *
                              (*(long *)((pointer)(local_130._0_8_ + local_f8 * 0x18) + 8) -
                               *(long *)(local_130._0_8_ + local_f8 * 0x18) >> 1) +
                              ((long)ctx.kerningPairs.
                                     super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)ctx.kerningPairs.
                                     super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
                      puVar3 = *(uint16_t **)((pointer)(local_130._0_8_ + uVar20 * 0x18) + 8);
                      for (puVar26 = *(uint16_t **)(local_130._0_8_ + uVar20 * 0x18);
                          puVar26 != puVar3; puVar26 = puVar26 + 1) {
                        uVar9 = *puVar26;
                        puVar4 = local_98.
                                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        for (puVar24 = local_98.
                                       super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar4;
                            puVar24 = puVar24 + 1) {
                          local_e0.glyphIdx2 = *puVar24;
                          local_e0.amount = iVar15;
                          local_e0.glyphIdx1 = uVar9;
                          std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::
                          emplace_back<dpfb::RawKerningPair>(&ctx.kerningPairs,&local_e0);
                        }
                      }
                    }
                  }
                  uVar20 = local_f8 + 1;
                }
                std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::~vector(&local_98);
                std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           *)local_130);
                this = &local_158;
                goto LAB_0011a255;
              }
            }
            else {
              if (uVar9 != 1) {
                pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
                str::format_abi_cxx11_
                          (&local_158,"Unknown format of \"GPOS\" pair adjustment subtable: %u",
                           (ulong)(uint)uVar9);
                streams::StreamError::runtime_error(pSVar19,&local_158);
                __cxa_throw(pSVar19,&streams::StreamError::typeinfo,
                            std::runtime_error::~runtime_error);
              }
              iVar15 = (*stream->_vptr_Stream[8])(stream);
              uVar9 = streams::Stream::readU16Be(stream);
              uVar10 = streams::Stream::readU16Be(stream);
              uVar11 = streams::Stream::readU16Be(stream);
              if ((char)((uVar11 & 4) >> 2) == '\0' && (uVar10 & 4) != 0) {
                uVar12 = streams::Stream::readU16Be(stream);
                iVar16 = (*stream->_vptr_Stream[8])(stream);
                lVar25 = CONCAT44(extraout_var_03,iVar15) + -2;
                (*stream->_vptr_Stream[7])(stream,(ulong)uVar9 + lVar25,0);
                readCovarageTable((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  local_130,stream);
                local_100 = (ulong)uVar12;
                if ((long)(local_130._8_8_ - local_130._0_8_) >> 1 != local_100) {
                  pSVar19 = (StreamError *)__cxa_allocate_exception(0x10);
                  str::format_abi_cxx11_
                            (&local_158,
                             "\"GPOS\" pair adjustment table format 1 pairSetCount (%u) doesn\'t match the number of glyphs in coverage table (%zu)"
                             ,local_100,(long)(local_130._8_8_ - local_130._0_8_) >> 1);
                  streams::StreamError::runtime_error(pSVar19,&local_158);
                  __cxa_throw(pSVar19,&streams::StreamError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var_04,iVar16),0);
                uVar20 = 0;
                while (uVar20 != local_100) {
                  uVar2 = *(unsigned_short *)(local_130._0_8_ + uVar20 * 2);
                  local_f8 = uVar20;
                  uVar9 = streams::Stream::readU16Be(stream);
                  iVar15 = (*stream->_vptr_Stream[8])(stream);
                  local_f0 = CONCAT44(extraout_var_05,iVar15);
                  (*stream->_vptr_Stream[7])(stream,(ulong)uVar9 + lVar25,0);
                  uVar9 = streams::Stream::readU16Be(stream);
                  while (bVar27 = uVar9 != 0, uVar9 = uVar9 - 1, bVar27) {
                    uVar12 = streams::Stream::readU16Be(stream);
                    readValuesForSize(stream,(uint32_t)lVar25,&ctx,(int *)&local_158,(uint)uVar10);
                    readValuesForSize(stream,(uint32_t)lVar25,&ctx,(int *)&local_98,(uint)uVar11);
                    if ((int)local_158._M_string_length != 0) {
                      local_130._28_4_ = (int)local_158._M_string_length;
                      local_130._24_2_ = uVar2;
                      local_130._26_2_ = uVar12;
                      std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::
                      emplace_back<dpfb::RawKerningPair>
                                (&ctx.kerningPairs,(RawKerningPair *)(local_130 + 0x18));
                    }
                  }
                  (*stream->_vptr_Stream[7])(stream,local_f0,0);
                  uVar20 = local_f8 + 1;
                }
                this = (string *)local_130;
LAB_0011a255:
                std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                          ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)this);
              }
            }
          }
          (*stream->_vptr_Stream[7])(stream,local_58,0);
        }
      }
    }
    (local_78->super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>).
    _M_impl.super__Vector_impl_data._M_start =
         ctx.kerningPairs.
         super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_78->super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         ctx.kerningPairs.
         super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_78->super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         ctx.kerningPairs.
         super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    ctx.kerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ctx.kerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ctx.kerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~_Vector_base
              (&ctx.kerningPairs.
                super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&lookupIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RawKerningPair> readKerningPairsGpos(
    Stream& stream,
    const SfntOffsetTable& sfntOffsetTable,
    const KerningParams& params)
{
    const auto tableOffset = sfntOffsetTable.getTableOffset(
        sfntTag('G', 'P', 'O', 'S'));
    if (tableOffset == 0)
        return {};

    stream.seek(tableOffset, SeekOrigin::set);

    const auto versionMajor = stream.readU16Be();
    if (versionMajor != 1)
        throw StreamError(str::format(
            "Unsupported \"GPOS\" major version %" PRIu16,
            versionMajor));
    // Skip minor version
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);

    // Skip scriptListOffset
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);
    const auto featureListOffset = stream.readU16Be();
    const auto lookupListOffset = stream.readU16Be();

    const auto lookupIndices = getAllKernFeatures(
        stream, tableOffset + featureListOffset);

    LookupContext ctx;
    ctx.pxSize = params.pxSize;
    ctx.scale = getScale(params);
    lookupFeatures(
        stream, tableOffset + lookupListOffset, ctx, lookupIndices);

    return std::move(ctx.kerningPairs);
}